

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall
GdlSetAttrItem::FixGlyphAttrsInRules
          (GdlSetAttrItem *this,GrcManager *pcman,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcInClasses,
          GdlRule *prule,int irit)

{
  pointer ppGVar1;
  GdlAttrValueSpec *pGVar2;
  GrcSymbolTableEntry *pGVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var_04;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined4 extraout_var_05;
  undefined8 uVar8;
  undefined4 extraout_var_06;
  long lVar9;
  undefined7 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *this_00;
  string *psVar12;
  undefined4 in_register_00000084;
  Symbol pGVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bool fGpointWith;
  bool fXYWith;
  bool fGpointAt;
  bool fXYAt;
  int nTmp;
  ulong local_268;
  GdlObject *local_260;
  undefined4 local_258;
  allocator local_251;
  GrcManager *local_250;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *local_248;
  vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *local_240;
  ulong local_238;
  GdlAttrValueSpec *local_230;
  GdlSetAttrItem *local_228;
  ulong local_220;
  ulong local_218;
  undefined8 local_210;
  ulong local_208;
  ulong local_200;
  string staT;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pGVar13 = (Symbol)CONCAT44(in_register_00000084,irit);
  local_258 = irit;
  local_250 = pcman;
  local_248 = vpglfcInClasses;
  GdlRuleItem::FixGlyphAttrsInRules(&this->super_GdlRuleItem,pcman,vpglfcInClasses,prule,irit);
  lVar16 = 0;
  fXYAt = false;
  fGpointAt = false;
  fXYWith = false;
  fGpointWith = false;
  iVar6 = (*(this->super_GdlRuleItem)._vptr_GdlRuleItem[0x26])(this);
  local_240 = &this->m_vpavs;
  local_260 = &(this->super_GdlRuleItem).super_GdlObject;
  local_208 = 0;
  local_200 = 0;
  local_218 = 0;
  local_220 = 0;
  local_238 = 0;
  local_210 = 0;
  local_268 = 0;
  local_228 = this;
  while( true ) {
    ppGVar1 = (local_228->m_vpavs).
              super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar9 = (long)(int)((ulong)((long)(local_228->m_vpavs).
                                      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1) >>
                       3);
    if (lVar9 <= lVar16) break;
    pGVar2 = ppGVar1[lVar16];
    pGVar3 = pGVar2->m_psymName;
    bVar4 = GrcSymbolTableEntry::IsAttachAtField(pGVar3);
    if (bVar4) {
      local_230 = pGVar2;
      std::__cxx11::string::string((string *)&staT,(string *)pGVar3);
      uVar14 = CONCAT71((int7)((ulong)lVar9 >> 8),1);
      if ((local_210 & 1) == 0) {
        bVar4 = std::operator==(&staT,"x");
        uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
        if (!bVar4) {
          bVar4 = std::operator==(&staT,"gpoint");
          uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
          if (!bVar4) {
            bVar4 = std::operator==(&staT,"gpath");
            uVar14 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
          }
        }
      }
      local_210 = uVar14;
      if ((local_238 & 1) == 0) {
        bVar4 = std::operator==(&staT,"y");
        if (bVar4) {
          uVar10 = (undefined7)(uVar14 >> 8);
          goto LAB_00122919;
        }
        bVar4 = std::operator==(&staT,"gpoint");
        uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
        if (!bVar4) {
          bVar4 = std::operator==(&staT,"gpath");
          uVar14 = CONCAT71(extraout_var_01,bVar4) & 0xffffffff;
        }
      }
      else {
        uVar10 = (undefined7)(uVar14 >> 8);
LAB_00122919:
        uVar14 = CONCAT71(uVar10,1);
      }
      psVar12 = &local_170;
      local_238 = uVar14;
      bVar4 = std::operator==(&staT,"gpath");
      if (bVar4) {
        std::__cxx11::string::string
                  ((string *)&local_d0,"Cannot use gpath function within a rule",(allocator *)&nTmp)
        ;
        GrcErrorList::AddError(&g_errorList,0x101f,local_260,&local_d0);
        psVar12 = &local_d0;
LAB_00122b72:
        std::__cxx11::string::~string((string *)psVar12);
      }
      else {
        bVar4 = std::operator==(&staT,"gpoint");
        if ((bVar4) &&
           (iVar7 = (*local_230->m_pexpValue->_vptr_GdlExpression[7])
                              (local_230->m_pexpValue,&nTmp,0), (char)iVar7 != '\0')) {
          std::__cxx11::string::string
                    ((string *)&local_f0,"Cannot use gpoint function within a rule",&local_251);
          GrcErrorList::AddError(&g_errorList,0x1020,local_260,&local_f0);
          psVar12 = &local_f0;
          goto LAB_00122b72;
        }
        if (((local_200 & 1) == 0) || (local_230->m_fFlattened == false)) {
          iVar7 = AttachToSettingValue(local_228);
          if (iVar7 == -2) {
            std::__cxx11::string::string
                      ((string *)&local_110,"Inappropriate value of attach.to",(allocator *)&nTmp);
            GrcErrorList::AddError(&g_errorList,0x1021,local_260,&local_110);
            uVar8 = std::__cxx11::string::~string((string *)&local_110);
            local_268 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
          }
          else {
            if (iVar7 == -1) {
              std::__cxx11::string::string
                        ((string *)psVar12,
                         "Attachment checks could not be done for value of attach.at",
                         (allocator *)&nTmp);
              GrcErrorList::AddWarning(&g_errorList,0x11a2,local_260,psVar12);
              goto LAB_00122b72;
            }
            uVar10 = (undefined7)(uVar14 >> 8);
            if (local_230->m_fFlattened == true) {
              local_200 = CONCAT71(uVar10,1);
              pGVar13 = (Symbol)&fXYAt;
              iVar7 = (*local_230->m_pexpValue->_vptr_GdlExpression[0x13])
                                (local_230->m_pexpValue,local_250,local_248,(ulong)(iVar7 - 1U),
                                 pGVar13,&fGpointAt);
              local_268 = CONCAT71((int7)(CONCAT44(extraout_var_06,iVar7) >> 8),1);
            }
            else {
              local_268 = CONCAT71(uVar10,1);
              GdlAttrValueSpec::FixGlyphAttrsInRules
                        (local_230,local_250,local_248,iVar7 - 1U,pGVar13);
            }
          }
        }
        else {
          local_200 = CONCAT71((int7)((ulong)local_230 >> 8),1);
        }
      }
LAB_00122b77:
      std::__cxx11::string::~string((string *)&staT);
    }
    else {
      bVar4 = GrcSymbolTableEntry::IsAttachWithField(pGVar3);
      if (bVar4) {
        local_230 = pGVar2;
        std::__cxx11::string::string((string *)&staT,(string *)pGVar3);
        uVar14 = CONCAT71((int7)((ulong)lVar9 >> 8),1);
        if ((local_220 & 1) == 0) {
          bVar4 = std::operator==(&staT,"x");
          uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
          if (!bVar4) {
            bVar4 = std::operator==(&staT,"gpoint");
            uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
            if (!bVar4) {
              bVar4 = std::operator==(&staT,"gpath");
              uVar14 = CONCAT71(extraout_var_00,bVar4) & 0xffffffff;
            }
          }
        }
        local_220 = uVar14;
        if ((local_218 & 1) == 0) {
          bVar4 = std::operator==(&staT,"y");
          if (bVar4) {
            uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
          }
          else {
            bVar4 = std::operator==(&staT,"gpoint");
            uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
            if (!bVar4) {
              bVar4 = std::operator==(&staT,"gpath");
              uVar14 = CONCAT71(extraout_var_02,bVar4) & 0xffffffff;
            }
          }
        }
        else {
          uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
        }
        local_218 = uVar14;
        bVar4 = std::operator==(&staT,"gpath");
        pGVar2 = local_230;
        if (!bVar4) {
          if (((local_208 & 1) == 0) || (local_230->m_fFlattened == false)) {
            if ((local_268 & 1) == 0) {
              iVar7 = AttachToSettingValue(local_228);
              local_268 = CONCAT71((int7)(CONCAT44(extraout_var_05,iVar7) >> 8),iVar7 != -1);
            }
            if (pGVar2->m_fFlattened == true) {
              local_208 = CONCAT71((int7)(uVar14 >> 8),1);
              pGVar13 = (Symbol)&fXYWith;
              (*pGVar2->m_pexpValue->_vptr_GdlExpression[0x13])
                        (pGVar2->m_pexpValue,local_250,local_248,(ulong)(uint)local_258,pGVar13,
                         &fGpointWith);
            }
            else {
              GdlAttrValueSpec::FixGlyphAttrsInRules(pGVar2,local_250,local_248,local_258,pGVar13);
            }
          }
          else {
            local_208 = CONCAT71(extraout_var_03,1);
          }
          goto LAB_00122b77;
        }
        psVar12 = &local_130;
        std::__cxx11::string::string
                  ((string *)psVar12,"Cannot use gpath function within a rule",(allocator *)&nTmp);
        GrcErrorList::AddError(&g_errorList,0x1022,local_260,psVar12);
        goto LAB_00122b72;
      }
      bVar4 = GrcSymbolTableEntry::IsComponentRef(pGVar3);
      if (bVar4) {
        CheckCompBox(local_228,local_250,pGVar3);
      }
      else if (CONCAT44(extraout_var_04,iVar6) != 0) {
        GrcSymbolTableEntry::IsAttachTo(pGVar3);
        GdlAttrValueSpec::FixGlyphAttrsInRules(pGVar2,local_250,local_248,local_258,pGVar13);
      }
    }
    lVar16 = lVar16 + 1;
  }
  if ((local_268 & 1) == 0) {
    if ((local_210 & 1) == 0) {
      if ((((local_238 & 1) == 0) && ((local_220 & 1) == 0)) && ((local_218 & 1) == 0))
      goto LAB_00122dac;
      if (((local_238 & 1) == 0) || ((local_268 & 1) != 0)) goto LAB_00122d65;
    }
    std::__cxx11::string::string
              ((string *)&local_190,"Cannot specify attach.at without attach.to",(allocator *)&staT)
    ;
    GrcErrorList::AddError(&g_errorList,0x1024,local_260,&local_190);
    psVar12 = &local_190;
  }
  else {
    if ((((local_210 & 1) != 0) && ((local_238 & 1) != 0)) &&
       (((local_220 & 1) != 0 && ((local_218 & 1) != 0)))) goto LAB_00122dac;
LAB_00122d65:
    std::__cxx11::string::string
              ((string *)&local_1b0,"Incomplete attachment specification",(allocator *)&staT);
    GrcErrorList::AddWarning(&g_errorList,0x11a3,local_260,&local_1b0);
    psVar12 = &local_1b0;
  }
  std::__cxx11::string::~string((string *)psVar12);
LAB_00122dac:
  uVar14 = (long)(local_228->m_vpavs).
                 super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(local_228->m_vpavs).
                 super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
  uVar15 = uVar14 & 0x7fffffff8;
  uVar14 = uVar14 >> 3;
  this_00 = local_240;
  do {
    if ((int)uVar14 < 1) {
      return;
    }
    pGVar3 = *(GrcSymbolTableEntry **)
              (*(long *)((long)(this_00->
                               super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                               )._M_impl.super__Vector_impl_data._M_start + (uVar15 - 8)) + 0x28);
    bVar4 = GrcSymbolTableEntry::IsAttachAtField(pGVar3);
    if ((bVar4) &&
       (*(char *)(*(long *)((long)(this_00->
                                  super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (uVar15 - 8)) + 0x44)
        == '\x01')) {
      if (fXYAt == false) {
        std::__cxx11::string::string((string *)&local_150,"x",(allocator *)&staT);
        _Var5 = std::operator==(&pGVar3->m_staFieldName,&local_150);
        pbVar11 = &local_150;
        if (_Var5) {
LAB_00122f0d:
          std::__cxx11::string::~string((string *)pbVar11);
        }
        else {
          std::__cxx11::string::string((string *)&local_50,"y",(allocator *)&nTmp);
          _Var5 = std::operator==(&pGVar3->m_staFieldName,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_150);
          this_00 = local_240;
          if (!_Var5) goto LAB_00122e1c;
        }
LAB_00122fbc:
        pGVar2 = *(GdlAttrValueSpec **)
                  ((long)(this_00->
                         super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                         )._M_impl.super__Vector_impl_data._M_start + (uVar15 - 8));
        if (pGVar2 != (GdlAttrValueSpec *)0x0) {
          GdlAttrValueSpec::~GdlAttrValueSpec(pGVar2);
        }
        operator_delete(pGVar2,0x48);
        std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::erase
                  (this_00,(GdlAttrValueSpec **)
                           ((long)(this_00->
                                  super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (uVar15 - 8)));
      }
      else {
LAB_00122e1c:
        if (fGpointAt == false) {
          pbVar11 = &local_70;
LAB_00122e71:
          std::__cxx11::string::string((string *)pbVar11,"gpoint",(allocator *)&staT);
          _Var5 = std::operator==(&pGVar3->m_staFieldName,pbVar11);
          std::__cxx11::string::~string((string *)pbVar11);
          this_00 = local_240;
          if (_Var5) goto LAB_00122fbc;
        }
      }
    }
    else {
      bVar4 = GrcSymbolTableEntry::IsAttachWithField(pGVar3);
      if ((bVar4) &&
         (*(char *)(*(long *)((long)(this_00->
                                    super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (uVar15 - 8)) +
                   0x44) == '\x01')) {
        if (fXYWith == false) {
          std::__cxx11::string::string((string *)&local_1d0,"x",(allocator *)&staT);
          _Var5 = std::operator==(&pGVar3->m_staFieldName,&local_1d0);
          pbVar11 = &local_1d0;
          if (_Var5) goto LAB_00122f0d;
          std::__cxx11::string::string((string *)&local_90,"y",(allocator *)&nTmp);
          _Var5 = std::operator==(&pGVar3->m_staFieldName,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_1d0);
          this_00 = local_240;
          if (_Var5) goto LAB_00122fbc;
        }
        if (fGpointWith != true) {
          pbVar11 = &local_b0;
          goto LAB_00122e71;
        }
      }
    }
    uVar14 = (ulong)((int)uVar14 - 1);
    uVar15 = uVar15 - 8;
  } while( true );
}

Assistant:

void GdlSetAttrItem::FixGlyphAttrsInRules(GrcManager * pcman,
	std::vector<GdlGlyphClassDefn *> & vpglfcInClasses, GdlRule * prule, int irit)
{
	//	method on superclass: process constraints.
	GdlRuleItem::FixGlyphAttrsInRules(pcman, vpglfcInClasses, prule, irit);

	bool fXYAt = false;			// true if the attach.at statements need to include x/y
	bool fGpointAt = false;		// true if the attach.at statements need to include gpoint
	bool fXYWith = false;		// true if the attach.with statements need to include x/y
	bool fGpointWith = false;	// true if the attach.with statements need to include gpoint
								// ...due to the way the glyph attributes are defined

	bool fAttachTo = false;		// true if an attach.to statement is present
	bool fAttachAtX = false;	// true if an attach.at.x/gpoint statement is present
	bool fAttachAtY = false;	// true if an attach.at.y/gpoint statement is present
	bool fAttachWithX = false;	// true if an attach.with.x/gpoint statement is present
	bool fAttachWithY = false;	// true if an attach.with.y/gpoint statement is present

	bool fDidAttachAt = false;	// did checks for flattened attach.at
	bool fDidAttachWith = false; // did checks for flattened attach.with

	Symbol psymOutput = OutputClassSymbol();

	//	Process attribute-setting statements.
	int ipavs;
	for (ipavs = 0; ipavs < signed(m_vpavs.size()); ipavs++)
	{
		GdlAttrValueSpec * pavs = m_vpavs[ipavs];

		//	Check that appropriate glyph attributes exist for the slot attributes that
		//	are making use of them.
		Symbol psym = pavs->m_psymName;
		Assert(psym->FitsSymbolType(ksymtSlotAttr) || psym->FitsSymbolType(ksymtFeature));

		if (psym->IsAttachAtField())
		{
			std::string staT = psym->LastField();
			fAttachAtX = fAttachAtX || staT == "x" || staT == "gpoint" || staT == "gpath";
			fAttachAtY = fAttachAtY || staT == "y" || staT == "gpoint" || staT == "gpath";

			if (staT == "gpath")
			{
				g_errorList.AddError(4127, this,
					"Cannot use gpath function within a rule");
				continue;
			}

			//	The engine currently can't handle single-point paths, and within the rule, we
			//	don't have a meaningful and consistent way to change such gpoint statements to
			//	x/y coordinates. So disallow gpoint statements in rules. If we find a way
			//	to make the engine handle single-point paths, take this code out.
			if (staT == "gpoint")
			{
				int nTmp;
				if (pavs->m_pexpValue->ResolveToInteger(&nTmp, false)) // constant, not glyph attr
				{
					g_errorList.AddError(4128, this,
						"Cannot use gpoint function within a rule");
					continue;
				}
			}

			if (fDidAttachAt && pavs->Flattened())
				//	The precompiler flattened the attach.at command into separate fields;
				//	in that case we don't need to check them twice.
				continue;

			//	The value of attach.at must be defined for the class of the slot
			//	receiving the attachment, not this slot.
			int srAttachToValue = AttachToSettingValue();	// 1-based
			if (srAttachToValue == -1)
				g_errorList.AddWarning(4514, this,
					"Attachment checks could not be done for value of attach.at");
			else if (srAttachToValue == -2)
			{
				fAttachTo = true;
				Assert(false);	// a VERY strange thing to happen.
				g_errorList.AddError(4129, this,
					"Inappropriate value of attach.to");
			}
			else
			{
				fAttachTo = true;
				if (pavs->Flattened())
				{
					pavs->CheckAttachAtPoint(pcman, vpglfcInClasses, srAttachToValue-1,
						&fXYAt, &fGpointAt);
					fDidAttachAt = true;
				}
				else
					pavs->FixGlyphAttrsInRules(pcman, vpglfcInClasses, srAttachToValue-1,
						psymOutput);
			}
		}

		else if (psym->IsAttachWithField())
		{
			std::string staT = psym->LastField();
			fAttachWithX = fAttachWithX || staT == "x" || staT == "gpoint" || staT == "gpath";
			fAttachWithY = fAttachWithY || staT == "y" || staT == "gpoint" || staT == "gpath";

			if (staT == "gpath")
			{
				g_errorList.AddError(4130, this,
					"Cannot use gpath function within a rule");
				continue;
			}

			if (fDidAttachWith && pavs->Flattened())
				//	The precompiler flattened the attach.with command into separate fields;
				//	in that case we don't need to check them twice.
				continue;

			if (!fAttachTo)
				fAttachTo = (AttachToSettingValue() != -1);

			if (pavs->Flattened())
			{
				pavs->CheckAttachWithPoint(pcman, vpglfcInClasses, irit,
					&fXYWith, &fGpointWith);
				fDidAttachWith = true;
			}
			else
				pavs->FixGlyphAttrsInRules(pcman, vpglfcInClasses, irit, psymOutput);
		}

		else if (psym->IsComponentRef())
		{
			CheckCompBox(pcman, psym);
		}

		else if (psymOutput == NULL)
		{	// error condition
		}
		else
		{
			if (psym->IsAttachTo())
			{
				GdlSlotRefExpression * pexpSR =
					dynamic_cast<GdlSlotRefExpression *>(pavs->m_pexpValue);
				if (pexpSR)
				{
					auto srAttachTo = static_cast<unsigned int>(pexpSR->SlotNumber());
					if (srAttachTo == 0)
					{
						// no attachment
					}
					else if (prule->NumberOfSlots() <= srAttachTo - 1)
					{
						//	slot out of range--error will be produced later
					}
					// Go ahead and allow this:
//					else if (!dynamic_cast<GdlSetAttrItem *>(prule->Item(srAttachTo - 1)))
//						g_errorList.AddError(4131, this,
//							"Cannot attach to an item in the context");
				}
			}
			pavs->FixGlyphAttrsInRules(pcman, vpglfcInClasses, irit, psymOutput);
		}
	}

	if ((fAttachTo || fAttachAtX || fAttachAtY || fAttachWithX || fAttachWithY) &&
		(!fAttachTo || !fAttachAtX || !fAttachAtY || !fAttachWithX || !fAttachWithY))
	{
		if ((fAttachAtX || fAttachAtY) && !fAttachTo)
			g_errorList.AddError(4132, this,
				"Cannot specify attach.at without attach.to");
		else
			g_errorList.AddWarning(4515, this,
				"Incomplete attachment specification");
	}

	//	Delete any superfluous attach commands (that were added in FlattenPointSlotAttrs
	//	but not needed); ie, either the x/y point fields or the gpath field. It's possible
	//	that we need to keep both versions, if one set of glyphs uses one and another set
	//	uses the other.
	for (ipavs = signed(m_vpavs.size()); --ipavs >= 0; )
	{
		bool fDeleteThis = false;
		Symbol psym = m_vpavs[ipavs]->m_psymName;
		if (psym->IsAttachAtField() && m_vpavs[ipavs]->Flattened())
		{
			if (!fXYAt && (psym->LastFieldIs("x") || psym->LastFieldIs("y")))
				//	Keep attach.at.gpoint; throw away x/y.
				fDeleteThis = true;
			else if (!fGpointAt && psym->LastFieldIs("gpoint"))
				//	Keep attach.at.x/y; throw away gpoint.
				fDeleteThis = true;
		}
		else if (psym->IsAttachWithField() && m_vpavs[ipavs]->Flattened())
		{
			if (!fXYWith && (psym->LastFieldIs("x") || psym->LastFieldIs("y")))
				//	Keep attach.with.gpoint; throw away x/y.
				fDeleteThis = true;
			else if (!fGpointWith && psym->LastFieldIs("gpoint"))
				//	Keep attach.with.x/y; throw away gpoint;
				fDeleteThis = true;
		}

		if (fDeleteThis)
		{
			delete m_vpavs[ipavs];
			m_vpavs.erase(m_vpavs.begin() + ipavs);
		}
	}
}